

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_> __thiscall
cmMakefile::RemoveFunctionBlocker(cmMakefile *this,cmFunctionBlocker *fb,cmListFileFunction *lff)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  size_type sVar3;
  size_type sVar4;
  cmListFileFunction *pcVar5;
  void *pvVar6;
  char cVar7;
  _func_int *p_Var8;
  ostream *poVar9;
  cmCommandContext *in_RCX;
  _func_int *p_Var10;
  _func_int *p_Var11;
  void *__src;
  long lVar12;
  _Map_pointer ppvVar13;
  cmListFileContext closingContext;
  ostringstream e;
  string local_210;
  cmListFileContext local_1f0;
  undefined1 local_1a8 [376];
  
  if ((_func_int **)fb[9].StartingContext.Line == fb[10]._vptr_cmFunctionBlocker) {
    p_Var8 = (_func_int *)0x0;
  }
  else {
    p_Var8 = fb[10]._vptr_cmFunctionBlocker[-1];
  }
  sVar3 = fb[9].StartingContext.FilePath._M_string_length;
  sVar4 = fb[9].StartingContext.FilePath.field_2._M_allocated_capacity;
  p_Var11 = (_func_int *)((long)(sVar4 - sVar3) >> 3);
  lVar12 = 0;
  p_Var10 = p_Var11;
  do {
    if (p_Var10 <= p_Var8) {
      (this->FindPackageRootPathStack).
      super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
      ppvVar13 = (_Map_pointer)0x0;
      goto LAB_002316ed;
    }
    p_Var10 = p_Var10 + -1;
    pcVar5 = *(cmListFileFunction **)((sVar4 - 8) + lVar12);
    lVar12 = lVar12 + -8;
  } while (pcVar5 != lff);
  cVar7 = (**(code **)((pcVar5->super_cmCommandContext).Name.Lower._M_dataplus._M_p + 8))();
  if (cVar7 == '\0') {
    cmListFileContext::FromCommandContext
              (&local_1f0,in_RCX,
               (string *)&(lff->super_cmCommandContext).Name.Original._M_string_length);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"A logical block opening on the line\n",0x24);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
    poVar9 = operator<<((ostream *)local_1a8,
                        (cmListFileContext *)
                        &(lff->super_cmCommandContext).Name.Lower._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"closes on the line\n",0x13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"  ",2);
    poVar9 = operator<<(poVar9,&local_1f0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"with mis-matching arguments.",0x1c);
    std::__cxx11::stringbuf::str();
    IssueMessage((cmMakefile *)fb,AUTHOR_WARNING,&local_210);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0.FilePath._M_dataplus._M_p != &local_1f0.FilePath.field_2) {
      operator_delete(local_1f0.FilePath._M_dataplus._M_p,
                      local_1f0.FilePath.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0.Name._M_dataplus._M_p != &local_1f0.Name.field_2) {
      operator_delete(local_1f0.Name._M_dataplus._M_p,
                      local_1f0.Name.field_2._M_allocated_capacity + 1);
    }
  }
  lVar2 = sVar3 + (long)p_Var11 * 8;
  ppvVar13 = *(_Map_pointer *)(lVar2 + lVar12);
  __src = (void *)(lVar2 + lVar12 + 8);
  pvVar6 = (void *)fb[9].StartingContext.FilePath.field_2._M_allocated_capacity;
  if (__src != pvVar6) {
    memmove((void *)(lVar2 + lVar12),__src,(long)pvVar6 + (-lVar12 - lVar2) + -8);
  }
  paVar1 = &fb[9].StartingContext.FilePath.field_2;
  paVar1->_M_allocated_capacity = paVar1->_M_allocated_capacity - 8;
LAB_002316ed:
  (this->FindPackageRootPathStack).
  super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = ppvVar13;
  return (__uniq_ptr_data<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>,_true,_true>)
         (__uniq_ptr_data<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<cmFunctionBlocker> cmMakefile::RemoveFunctionBlocker(
  cmFunctionBlocker* fb, const cmListFileFunction& lff)
{
  // Find the function blocker stack barrier for the current scope.
  // We only remove a blocker whose index is not less than the barrier.
  FunctionBlockersType::size_type barrier = 0;
  if (!this->FunctionBlockerBarriers.empty()) {
    barrier = this->FunctionBlockerBarriers.back();
  }

  // Search for the function blocker whose scope this command ends.
  for (FunctionBlockersType::size_type i = this->FunctionBlockers.size();
       i > barrier; --i) {
    std::vector<cmFunctionBlocker*>::iterator pos =
      this->FunctionBlockers.begin() + (i - 1);
    if (*pos == fb) {
      // Warn if the arguments do not match, but always remove.
      if (!(*pos)->ShouldRemove(lff, *this)) {
        cmListFileContext const& lfc = fb->GetStartingContext();
        cmListFileContext closingContext =
          cmListFileContext::FromCommandContext(lff, lfc.FilePath);
        std::ostringstream e;
        /* clang-format off */
        e << "A logical block opening on the line\n"
          << "  " << lfc << "\n"
          << "closes on the line\n"
          << "  " << closingContext << "\n"
          << "with mis-matching arguments.";
        /* clang-format on */
        this->IssueMessage(MessageType::AUTHOR_WARNING, e.str());
      }
      cmFunctionBlocker* b = *pos;
      this->FunctionBlockers.erase(pos);
      return std::unique_ptr<cmFunctionBlocker>(b);
    }
  }

  return std::unique_ptr<cmFunctionBlocker>();
}